

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O0

int lj_cf_buffer_method___tostring(lua_State *L)

{
  TValue *pTVar1;
  SBufExt *pSVar2;
  GCstr *pGVar3;
  SBufExt *sbx;
  lua_State *L_local;
  
  pSVar2 = buffer_tobuf(L);
  pTVar1 = L->top;
  pGVar3 = lj_str_new(L,pSVar2->r,(ulong)(uint)((int)pSVar2->w - (int)pSVar2->r));
  pTVar1[-1].u64 = (ulong)pGVar3 | 0xfffd800000000000;
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(buffer_method___tostring)	LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobuf(L);
  setstrV(L, L->top-1, lj_str_new(L, sbx->r, sbufxlen(sbx)));
  lj_gc_check(L);
  return 1;
}